

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

BOOL CreateDirectoryA(LPCSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  long lVar1;
  int iVar2;
  char *lpPath;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sizeInBytes;
  DWORD dwErrCode;
  BOOL BVar11;
  char *string;
  long in_FS_OFFSET;
  char acStack_50 [20];
  DWORD local_3c;
  long lStack_38;
  DWORD dwLastError;
  
  pcVar10 = acStack_50 + 8;
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  pcVar4 = acStack_50 + 8;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0031dadb;
  if (lpSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    if (lpPathName == (LPCSTR)0x0) {
      local_3c = 3;
      acStack_50[0] = '\x03';
      acStack_50[1] = '\0';
      acStack_50[2] = '\0';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
LAB_0031d9fb:
      pcVar10 = acStack_50 + 8;
      dwErrCode = (DWORD)acStack_50._0_8_;
      lpPath = (char *)0x0;
      goto LAB_0031d9fe;
    }
    acStack_50[0] = '\x14';
    acStack_50[1] = -0x27;
    acStack_50[2] = '1';
    acStack_50[3] = '\0';
    acStack_50[4] = '\0';
    acStack_50[5] = '\0';
    acStack_50[6] = '\0';
    acStack_50[7] = '\0';
    lpPath = PAL__strdup(lpPathName);
    if (lpPath == (char *)0x0) {
      pcVar4 = acStack_50 + 8;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031dadb;
      local_3c = 8;
      acStack_50[0] = '\b';
      acStack_50[1] = '\0';
      acStack_50[2] = '\0';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      goto LAB_0031d9fb;
    }
    acStack_50[0] = '(';
    acStack_50[1] = -0x27;
    acStack_50[2] = '1';
    acStack_50[3] = '\0';
    acStack_50[4] = '\0';
    acStack_50[5] = '\0';
    acStack_50[6] = '\0';
    acStack_50[7] = '\0';
    FILEDosToUnixPathA(lpPath);
    acStack_50[0] = '0';
    acStack_50[1] = -0x27;
    acStack_50[2] = '1';
    acStack_50[3] = '\0';
    acStack_50[4] = '\0';
    acStack_50[5] = '\0';
    acStack_50[6] = '\0';
    acStack_50[7] = '\0';
    sVar3 = strlen(lpPath);
    sVar5 = sVar3;
    while ((1 < (int)sVar5 && (lpPath[(sVar5 & 0xffffffff) - 1] == '/'))) {
      lpPath[(sVar5 & 0xffffffff) - 1] = '\0';
      sVar5 = (size_t)((int)sVar5 - 1);
    }
    pcVar4 = acStack_50 + 8;
    string = lpPath;
    if (*lpPath != '/') {
      acStack_50[0] = '^';
      acStack_50[1] = -0x27;
      acStack_50[2] = '1';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      pcVar4 = PAL__getcwd((char *)0x0,0x400);
      if (pcVar4 != (char *)0x0) {
        acStack_50[0] = 'r';
        acStack_50[1] = -0x27;
        acStack_50[2] = '1';
        acStack_50[3] = '\0';
        acStack_50[4] = '\0';
        acStack_50[5] = '\0';
        acStack_50[6] = '\0';
        acStack_50[7] = '\0';
        sVar5 = strlen(pcVar4);
        sizeInBytes = (size_t)((int)sVar5 + (int)sVar3 + 2);
        lVar1 = -(sizeInBytes + 0xf & 0xfffffffffffffff0);
        string = acStack_50 + lVar1 + 8;
        pcVar8 = acStack_50 + lVar1;
        pcVar8[0] = -0x5d;
        pcVar8[1] = -0x27;
        pcVar8[2] = '1';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        sprintf_s(string,sizeInBytes,"%s/%s",pcVar4,lpPath);
        pcVar9 = acStack_50 + lVar1;
        pcVar9[0] = -0x55;
        pcVar9[1] = -0x27;
        pcVar9[2] = '1';
        pcVar9[3] = '\0';
        pcVar9[4] = '\0';
        pcVar9[5] = '\0';
        pcVar9[6] = '\0';
        pcVar9[7] = '\0';
        PAL_free(pcVar4);
        pcVar4 = string;
        goto LAB_0031d9ab;
      }
      pcVar4 = acStack_50 + 8;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031dadb;
      acStack_50[0] = -0x6f;
      acStack_50[1] = -0x26;
      acStack_50[2] = '1';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      piVar6 = __errno_location();
      acStack_50[0] = -0x68;
      acStack_50[1] = -0x26;
      acStack_50[2] = '1';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      strerror(*piVar6);
      acStack_50[0] = -99;
      acStack_50[1] = -0x26;
      acStack_50[2] = '1';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      local_3c = DIRGetLastErrorFromErrno();
LAB_0031daa2:
      dwErrCode = local_3c;
      if (local_3c != 0) goto LAB_0031d9fe;
      goto LAB_0031da03;
    }
LAB_0031d9ab:
    pcVar10 = pcVar4;
    pcVar10[-8] = -0x4d;
    pcVar10[-7] = -0x27;
    pcVar10[-6] = '1';
    pcVar10[-5] = '\0';
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    FILECanonicalizePath(string);
    pcVar10[-8] = -0x45;
    pcVar10[-7] = -0x27;
    pcVar10[-6] = '1';
    pcVar10[-5] = '\0';
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    sVar5 = strlen(string);
    pcVar4 = pcVar10;
    if (0x3ff < sVar5) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031dadb;
      local_3c = 0xce;
      dwErrCode = 0xce;
      goto LAB_0031d9fe;
    }
    pcVar10[-8] = 'K';
    pcVar10[-7] = -0x26;
    pcVar10[-6] = '1';
    pcVar10[-5] = '\0';
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    iVar2 = mkdir(string,0x1ff);
    if (iVar2 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031dadb;
      pcVar10[-8] = '`';
      pcVar10[-7] = -0x26;
      pcVar10[-6] = '1';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      if (iVar2 != 0x14) {
        if (iVar2 == 0x11) {
          local_3c = 0xb7;
          dwErrCode = 0xb7;
          goto LAB_0031d9fe;
        }
        if (iVar2 != 2) {
          local_3c = 5;
          pcVar7 = pcVar10 + -8;
          pcVar10[-8] = '\x05';
          pcVar10[-7] = '\0';
          pcVar10[-6] = '\0';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          goto LAB_0031d900;
        }
      }
      pcVar10[-8] = -0x80;
      pcVar10[-7] = -0x26;
      pcVar10[-6] = '1';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      FILEGetProperNotFoundError(string,&local_3c);
      goto LAB_0031daa2;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031dadb;
    pcVar10[-8] = '\x01';
    pcVar10[-7] = '\0';
    pcVar10[-6] = '\0';
    pcVar10[-5] = '\0';
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    BVar11 = (BOOL)*(undefined8 *)(pcVar10 + -8);
  }
  else {
    lpPath = (char *)0x0;
    acStack_50[0] = -0x1a;
    acStack_50[1] = -0x28;
    acStack_50[2] = '1';
    acStack_50[3] = '\0';
    acStack_50[4] = '\0';
    acStack_50[5] = '\0';
    acStack_50[6] = '\0';
    acStack_50[7] = '\0';
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x21e);
    acStack_50[0] = -9;
    acStack_50[1] = -0x28;
    acStack_50[2] = '1';
    acStack_50[3] = '\0';
    acStack_50[4] = '\0';
    acStack_50[5] = '\0';
    acStack_50[6] = '\0';
    acStack_50[7] = '\0';
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    local_3c = 0x57;
    pcVar7 = acStack_50;
    acStack_50[0] = 'W';
    acStack_50[1] = '\0';
    acStack_50[2] = '\0';
    acStack_50[3] = '\0';
    acStack_50[4] = '\0';
    acStack_50[5] = '\0';
    acStack_50[6] = '\0';
    acStack_50[7] = '\0';
LAB_0031d900:
    pcVar10 = (char *)((long)pcVar7 + 8);
    dwErrCode = (DWORD)*(undefined8 *)pcVar7;
LAB_0031d9fe:
    *(undefined8 *)(pcVar10 + -8) = 0x31da03;
    SetLastError(dwErrCode);
LAB_0031da03:
    BVar11 = 0;
  }
  *(undefined8 *)(pcVar10 + -8) = 0x31da0e;
  PAL_free(lpPath);
  pcVar4 = pcVar10;
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
      *(code **)(pcVar10 + -8) = RemoveDirectoryA;
      __stack_chk_fail();
    }
    return BVar11;
  }
LAB_0031dadb:
  *(undefined8 *)(pcVar4 + -8) = 0x31dae0;
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryA(
         IN LPCSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    char *realPath;
    LPSTR UnixPathName = NULL;
    int pathLength;
    int i;
    const int mode = S_IRWXU | S_IRWXG | S_IRWXO;

    PERF_ENTRY(CreateDirectoryA);
    ENTRY("CreateDirectoryA(lpPathName=%p (%s), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:"NULL",
          lpPathName?lpPathName:"NULL", lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    // Windows returns ERROR_PATH_NOT_FOUND when called with NULL.
    // If we don't have this check, strdup(NULL) segfaults.
    if (lpPathName == NULL)
    {
        ERROR("CreateDirectoryA called with NULL pathname!\n");
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    UnixPathName = PAL__strdup(lpPathName);
    if (UnixPathName == NULL )
    {
        ERROR("PAL__strdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    FILEDosToUnixPathA( UnixPathName );
    // Remove any trailing slashes at the end because mkdir might not
    // handle them appropriately on all platforms.
    pathLength = strlen(UnixPathName);
    i = pathLength;
    while(i > 1)
    {
        if(UnixPathName[i - 1] =='/')
        {
            UnixPathName[i - 1]='\0';
            i--;
        }
        else
        {
            break;
        }
    }

    // Check the constraint for the real path length (should be < MAX_LONGPATH).

    // Get an absolute path.
    if (UnixPathName[0] == '/')
    {
        realPath = UnixPathName;
    }
    else
    {
        const char *cwd = PAL__getcwd(NULL, MAX_LONGPATH);        
        if (NULL == cwd)
        {
            WARN("Getcwd failed with errno=%d [%s]\n", errno, strerror(errno));
            dwLastError = DIRGetLastErrorFromErrno();
            goto done;
        }

        // Copy cwd, '/', path
        int iLen = strlen(cwd) + 1 + pathLength + 1;
        realPath = static_cast<char *>(alloca(iLen));
        sprintf_s(realPath, iLen, "%s/%s", cwd, UnixPathName);

        PAL_free((char *)cwd);
    }
    
    // Canonicalize the path so we can determine its length.
    FILECanonicalizePath(realPath);

    if (strlen(realPath) >= MAX_LONGPATH)
    {
        WARN("UnixPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    if ( mkdir(realPath, mode) != 0 )
    {
        TRACE("Creation of directory [%s] was unsuccessful, errno = %d.\n",
              UnixPathName, errno);

        switch( errno )
        {
        case ENOTDIR:
            /* FALL THROUGH */
        case ENOENT:
            FILEGetProperNotFoundError( realPath, &dwLastError );
            goto done;
        case EEXIST:
            dwLastError = ERROR_ALREADY_EXISTS;
            break;
        default:
            dwLastError = ERROR_ACCESS_DENIED;
        }
    }
    else
    {
        TRACE("Creation of directory [%s] was successful.\n", UnixPathName);
        bRet = TRUE;
    }

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    PAL_free( UnixPathName );
    LOGEXIT("CreateDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryA);
    return bRet;
}